

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturemanager.cpp
# Opt level: O3

bool __thiscall
QGestureManager::filterEvent(QGestureManager *this,QGraphicsObject *receiver,QEvent *event)

{
  QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
  *pQVar1;
  long lVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  QGraphicsObject *pQVar5;
  _Rb_tree_node_base *p_Var6;
  long lVar7;
  _Rb_tree_header *p_Var8;
  _Rb_tree_node_base *p_Var9;
  long in_FS_OFFSET;
  undefined8 local_a0;
  QMultiMap<QObject_*,_Qt::GestureType> local_98;
  QVLABase<Qt::GestureType> local_90;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_90.super_QVLABaseBase.ptr = &local_78;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_90.super_QVLABaseBase.a = 0x10;
  local_90.super_QVLABaseBase.s = 0;
  local_98.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::multimap<QObject_*,_Qt::GestureType,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_Qt::GestureType>_>_>_>_>
        )(totally_ordered_wrapper<QMapData<std::multimap<QObject_*,_Qt::GestureType,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_Qt::GestureType>_>_>_>_*>
          )0x0;
  pQVar1 = (((receiver->super_QGraphicsItem).d_ptr.d)->gestureContext).d.d.ptr;
  if ((pQVar1 != (QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
                  *)0x0) && ((pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    p_Var4 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
    p_Var8 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 != p_Var8) {
      do {
        p_Var6 = p_Var4 + 1;
        if (local_90.super_QVLABaseBase.s == local_90.super_QVLABaseBase.a) {
          local_a0 = (QGraphicsObject *)CONCAT44(local_a0._4_4_,p_Var6->_M_color);
          QVLABase<Qt::GestureType>::emplace_back_impl<Qt::GestureType>
                    (&local_90,0x10,&local_78,(GestureType *)&local_a0);
        }
        else {
          QVLABase<Qt::GestureType>::emplace_back_impl<Qt::GestureType_const&>
                    (&local_90,0x10,&local_78,&p_Var6->_M_color);
        }
        local_a0 = receiver;
        QMultiMap<QObject_*,_Qt::GestureType>::insert
                  (&local_98,(QObject **)&local_a0,&p_Var6->_M_color);
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var8);
    }
  }
  pQVar5 = QGraphicsItem::parentObject(&receiver->super_QGraphicsItem);
  if (pQVar5 != (QGraphicsObject *)0x0) {
    do {
      pQVar1 = (((pQVar5->super_QGraphicsItem).d_ptr.d)->gestureContext).d.d.ptr;
      if (pQVar1 == (QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
                     *)0x0) {
        p_Var6 = (_Rb_tree_node_base *)0x0;
      }
      else {
        p_Var6 = *(_Base_ptr *)
                  ((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
      }
      p_Var9 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (pQVar1 == (QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
                     *)0x0) {
        p_Var9 = (_Rb_tree_node_base *)0x0;
      }
      for (; p_Var6 != p_Var9; p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
        if ((p_Var6[1].field_0x4 & 1) == 0) {
          lVar7 = local_90.super_QVLABaseBase.s * 4;
          do {
            if (lVar7 == 0) {
              if (local_90.super_QVLABaseBase.s == local_90.super_QVLABaseBase.a) {
                local_a0._4_4_ = (undefined4)((ulong)local_a0 >> 0x20);
                local_a0 = (QGraphicsObject *)CONCAT44(local_a0._4_4_,p_Var6[1]._M_color);
                QVLABase<Qt::GestureType>::emplace_back_impl<Qt::GestureType>
                          (&local_90,0x10,&local_78,(GestureType *)&local_a0);
              }
              else {
                QVLABase<Qt::GestureType>::emplace_back_impl<Qt::GestureType_const&>
                          (&local_90,0x10,&local_78,&p_Var6[1]._M_color);
              }
              local_a0 = pQVar5;
              QMultiMap<QObject_*,_Qt::GestureType>::insert
                        (&local_98,(QObject **)&local_a0,&p_Var6[1]._M_color);
              break;
            }
            lVar2 = lVar7 + -4;
            lVar7 = lVar7 + -4;
          } while (*(_Rb_tree_color *)((long)local_90.super_QVLABaseBase.ptr + lVar2) !=
                   p_Var6[1]._M_color);
        }
      }
      pQVar5 = QGraphicsItem::parentObject(&pQVar5->super_QGraphicsItem);
    } while (pQVar5 != (QGraphicsObject *)0x0);
  }
  if ((local_98.d.d.ptr ==
       (totally_ordered_wrapper<QMapData<std::multimap<QObject_*,_Qt::GestureType,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_Qt::GestureType>_>_>_>_*>
        )0x0) || (*(size_t *)((long)local_98.d.d.ptr + 0x30) == 0)) {
    bVar3 = false;
  }
  else {
    bVar3 = filterEventThroughContexts(this,&local_98,event);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QObject_*,_Qt::GestureType,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_Qt::GestureType>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_98.d);
  if ((undefined1 **)local_90.super_QVLABaseBase.ptr != &local_78) {
    QtPrivate::sizedFree(local_90.super_QVLABaseBase.ptr,local_90.super_QVLABaseBase.a << 2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QGestureManager::filterEvent(QGraphicsObject *receiver, QEvent *event)
{
    QVarLengthArray<Qt::GestureType, 16> types;
    QMultiMap<QObject *, Qt::GestureType> contexts;
    QGraphicsObject *item = receiver;
    if (!item->QGraphicsItem::d_func()->gestureContext.isEmpty()) {
        typedef QMap<Qt::GestureType, Qt::GestureFlags>::const_iterator ContextIterator;
        for(ContextIterator it = item->QGraphicsItem::d_func()->gestureContext.constBegin(),
            e = item->QGraphicsItem::d_func()->gestureContext.constEnd(); it != e; ++it) {
            types.push_back(it.key());
            contexts.insert(item, it.key());
        }
    }
    // find all gesture contexts for the graphics object tree
    item = item->parentObject();
    while (item)
    {
        typedef QMap<Qt::GestureType, Qt::GestureFlags>::const_iterator ContextIterator;
        for (ContextIterator it = item->QGraphicsItem::d_func()->gestureContext.constBegin(),
             e = item->QGraphicsItem::d_func()->gestureContext.constEnd(); it != e; ++it) {
            if (!(it.value() & Qt::DontStartGestureOnChildren)) {
                if (!types.contains(it.key())) {
                    types.push_back(it.key());
                    contexts.insert(item, it.key());
                }
            }
        }
        item = item->parentObject();
    }
    return contexts.isEmpty() ? false : filterEventThroughContexts(contexts, event);
}